

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
          *base,tuple<testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                *generators,bool is_end)

{
  _func_int **in_RSI;
  ParamIteratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  *in_RDI;
  tuple<testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  *in_stack_ffffffffffffff78;
  tuple<testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  *in_stack_ffffffffffffff80;
  ParamGenerator<BLOCK_SIZE> *in_stack_ffffffffffffff88;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this_00;
  
  ParamIteratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::ParamIteratorInterface(in_RDI);
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f929b8;
  in_RDI[1]._vptr_ParamIteratorInterface = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
              *)0x9f44c2);
  ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>::begin
            ((ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>
              *)in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
              *)0x9f44db);
  ParamGenerator<BLOCK_SIZE>::begin(in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  ::
  tuple<testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>
              *)in_stack_ffffffffffffff78,(ParamIterator<BLOCK_SIZE> *)0x9f44fe);
  ParamIterator<BLOCK_SIZE>::~ParamIterator((ParamIterator<BLOCK_SIZE> *)0x9f450a);
  ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>::
  ~ParamIterator((ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>
                  *)0x9f4514);
  std::
  get<0ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
              *)0x9f452c);
  ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>::end
            ((ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>
              *)in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamGenerator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
              *)0x9f4545);
  ParamGenerator<BLOCK_SIZE>::end(in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  ::
  tuple<testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>
              *)in_stack_ffffffffffffff78,(ParamIterator<BLOCK_SIZE> *)0x9f4568);
  ParamIterator<BLOCK_SIZE>::~ParamIterator((ParamIterator<BLOCK_SIZE> *)0x9f4574);
  ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>::
  ~ParamIterator((ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>
                  *)0x9f457e);
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)(in_RDI + 6);
  std::
  tuple<testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  ::tuple(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  shared_ptr<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::shared_ptr((shared_ptr<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
                *)0x9f45d5);
  ComputeCurrentValue(this_00);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }